

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

ON_3dPoint * __thiscall
ON_OBSOLETE_V5_DimAngular::Dim3dPoint
          (ON_3dPoint *__return_storage_ptr__,ON_OBSOLETE_V5_DimAngular *this,int point_index)

{
  double dVar1;
  ON_2dPoint OVar2;
  
  OVar2 = Dim2dPoint(this,point_index);
  dVar1 = OVar2.x;
  if ((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) {
    ON_Plane::PointAt(__return_storage_ptr__,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,dVar1,
                      OVar2.y);
  }
  else {
    __return_storage_ptr__->z = ON_3dPoint::UnsetPoint.z;
    dVar1 = ON_3dPoint::UnsetPoint.y;
    __return_storage_ptr__->x = ON_3dPoint::UnsetPoint.x;
    __return_storage_ptr__->y = dVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_OBSOLETE_V5_DimAngular::Dim3dPoint( int point_index ) const
{
  ON_2dPoint p2 = Dim2dPoint(point_index);
  if (ON_UNSET_VALUE == p2.x)
    return ON_3dPoint::UnsetPoint;

  ON_3dPoint p = m_plane.PointAt(p2.x, p2.y);
  return p;

  //return (ON_UNSET_VALUE == p2.x) ? ON_3dPoint::UnsetPoint : m_plane.PointAt(p2.x,p2.y);
}